

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O0

void __thiscall Nes_Vrc6_Apu::Nes_Vrc6_Apu(Nes_Vrc6_Apu *this)

{
  Nes_Vrc6_Apu *in_RDI;
  Nes_Vrc6_Apu *unaff_retaddr;
  Nes_Vrc6_Apu *buf;
  
  buf = in_RDI;
  Blip_Synth<8,_1>::Blip_Synth((Blip_Synth<8,_1> *)0x82eb0c);
  Blip_Synth<12,_1>::Blip_Synth((Blip_Synth<12,_1> *)0x82eb1d);
  output(unaff_retaddr,(Blip_Buffer *)buf);
  volume(unaff_retaddr,(double)buf);
  reset(in_RDI);
  return;
}

Assistant:

Nes_Vrc6_Apu::Nes_Vrc6_Apu()
{
	output( NULL );
	volume( 1.0 );
	reset();
}